

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

QByteArray *
qGssapiContinue(QByteArray *__return_storage_ptr__,QAuthenticatorPrivate *ctx,
               QByteArrayView challenge)

{
  QGssApiHandles *pQVar1;
  Data *pDVar2;
  uint majStat;
  gss_buffer_desc *pgVar3;
  QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *this;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  gss_buffer_desc inBuf;
  undefined4 local_30;
  OM_uint32 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  inBuf.length = 0;
  inBuf.value = (void *)0x0;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  if (challenge.m_size == 0) {
    pgVar3 = (gss_buffer_desc *)0x0;
  }
  else {
    pgVar3 = &inBuf;
    inBuf.length = challenge.m_size;
    inBuf.value = challenge.m_data;
  }
  local_2c = 0xaaaaaaaa;
  local_30 = 0xaaaaaaaa;
  pQVar1 = (ctx->gssApiHandles).d;
  majStat = gss_init_sec_context
                      (&local_2c,0,pQVar1,pQVar1->targetName,0,2,0,0,pgVar3,0,&local_58,0,0);
  if (CONCAT44(uStack_54,local_58) != 0) {
    QByteArray::QByteArray
              ((QByteArray *)&local_78,(char *)CONCAT44(uStack_4c,uStack_50),
               CONCAT44(uStack_54,local_58));
    pDVar2 = local_78.d;
    local_78.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = local_78.ptr;
    local_78.ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = local_78.size;
    local_78.size = 0;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  }
  this = &ctx->gssApiHandles;
  gss_release_buffer(&local_30,&local_58);
  if (majStat < 2) {
    if (majStat != 0) goto LAB_0019beff;
    gss_release_name(&local_30);
  }
  else {
    q_GSSAPI_error("gss_init_sec_context error",majStat,local_2c);
    gss_release_name(&local_30,&this->d->targetName);
    if (this->d->gssCtx != (gss_ctx_id_t)0x0) {
      gss_delete_sec_context(&local_30,this->d,0);
    }
  }
  QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::reset
            (this,(QGssApiHandles *)0x0);
LAB_0019beff:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qGssapiContinue(QAuthenticatorPrivate *ctx, QByteArrayView challenge)
{
    OM_uint32 majStat, minStat, ignored;
    QByteArray result;
    gss_buffer_desc inBuf = {0, nullptr}; // GSS input token
    gss_buffer_desc outBuf; // GSS output token

    if (!challenge.isEmpty()) {
        inBuf.value = const_cast<char*>(challenge.data());
        inBuf.length = challenge.size();
    }

    majStat = gss_init_sec_context(&minStat,
                                   GSS_C_NO_CREDENTIAL,
                                   &ctx->gssApiHandles->gssCtx,
                                   ctx->gssApiHandles->targetName,
                                   GSS_C_NO_OID,
                                   GSS_C_MUTUAL_FLAG,
                                   0,
                                   GSS_C_NO_CHANNEL_BINDINGS,
                                   challenge.isEmpty() ? GSS_C_NO_BUFFER : &inBuf,
                                   nullptr,
                                   &outBuf,
                                   nullptr,
                                   nullptr);

    if (outBuf.length != 0)
        result = QByteArray(reinterpret_cast<const char*>(outBuf.value), outBuf.length);
    gss_release_buffer(&ignored, &outBuf);

    if (majStat != GSS_S_COMPLETE && majStat != GSS_S_CONTINUE_NEEDED) {
        q_GSSAPI_error("gss_init_sec_context error", majStat, minStat);
        gss_release_name(&ignored, &ctx->gssApiHandles->targetName);
        if (ctx->gssApiHandles->gssCtx)
            gss_delete_sec_context(&ignored, &ctx->gssApiHandles->gssCtx, GSS_C_NO_BUFFER);
        ctx->gssApiHandles.reset(nullptr);
    }

    if (majStat == GSS_S_COMPLETE) {
        gss_release_name(&ignored, &ctx->gssApiHandles->targetName);
        ctx->gssApiHandles.reset(nullptr);
    }

    return result;
}